

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

MatrixXd * __thiscall
lf::uscalfe::FeLagrangeO2Quad<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,FeLagrangeO2Quad<double> *this)

{
  CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_> *pCVar1;
  Scalar local_168;
  Scalar local_160;
  Scalar local_158;
  Scalar local_150;
  Scalar local_148;
  Scalar local_140;
  Scalar local_138;
  Scalar local_130;
  Scalar local_128;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0 [3];
  Scalar local_d8;
  Scalar local_d0;
  CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_> local_c8;
  DenseBase<Eigen::Matrix<double,_2,_9,_0,_2,_9>_> local_a8 [8];
  Matrix<double,_2,_9,_0,_2,_9> nodes;
  FeLagrangeO2Quad<double> *this_local;
  
  nodes.super_PlainObjectBase<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>.m_storage.m_data.array[0x11] =
       (double)this;
  Eigen::Matrix<double,_2,_9,_0,_2,_9>::Matrix((Matrix<double,_2,_9,_0,_2,_9> *)local_a8);
  local_d0 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator<<(&local_c8,local_a8,&local_d0);
  local_d8 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (&local_c8,&local_d8);
  local_f0[0] = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,local_f0);
  local_f8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_f8);
  local_100 = 0.5;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_100);
  local_108 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_108);
  local_110 = 0.5;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_110);
  local_118 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_118);
  local_120 = 0.5;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_120);
  local_128 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_128);
  local_130 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_130);
  local_138 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_138);
  local_140 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_140);
  local_148 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_148);
  local_150 = 0.5;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_150);
  local_158 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_158);
  local_160 = 0.5;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_
                     (pCVar1,&local_160);
  local_168 = 0.5;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::operator_(pCVar1,&local_168);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_9,_0,_2,_9>_>::~CommaInitializer(&local_c8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,9,0,2,9>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::Matrix<double,_2,_9,_0,_2,_9>_> *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    Eigen::Matrix<double, 2, 9> nodes;

    // clang-format off
    nodes << 0.0, 1.0, 1.0, 0.0,  0.5, 1.0, 0.5, 0.0,  0.5,
               0.0, 0.0, 1.0, 1.0,  0.0, 0.5, 1.0, 0.5,  0.5;
    // clang-format on
    return nodes;
  }